

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_noderel.cc
# Opt level: O0

RC __thiscall QL_NodeRel::GetNextRec(QL_NodeRel *this,RM_Record *rec)

{
  char *local_30;
  char *recData;
  RM_Record *pRStack_20;
  RC rc;
  RM_Record *rec_local;
  QL_NodeRel *this_local;
  
  recData._4_4_ = 0;
  pRStack_20 = rec;
  rec_local = (RM_Record *)this;
  this_local._4_4_ = RetrieveNextRec(this,rec,&local_30);
  if (this_local._4_4_ == 0) {
    this_local._4_4_ = 0;
  }
  else if ((this_local._4_4_ == 0x6e) || (this_local._4_4_ == 0xd3)) {
    this_local._4_4_ = 0x199;
  }
  return this_local._4_4_;
}

Assistant:

RC QL_NodeRel::GetNextRec(RM_Record &rec){
  RC rc = 0;
  char *recData;
  if((rc = RetrieveNextRec(rec, recData))){
    if(rc == RM_EOF || rc == IX_EOF)
      return (QL_EOI);
    return (rc);
  }
  return (0);
}